

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::OBJMaterial> *material,ssize_t id)

{
  pointer pcVar1;
  int __oflag;
  shared_ptr<embree::Texture> local_118;
  shared_ptr<embree::Texture> local_108;
  shared_ptr<embree::Texture> local_f8;
  shared_ptr<embree::Texture> local_e8;
  shared_ptr<embree::Texture> local_d8;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"material","");
  pcVar1 = (material->ptr->super_MaterialNode).super_Node.name._M_dataplus._M_p;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar1,
             pcVar1 + (material->ptr->super_MaterialNode).super_Node.name._M_string_length);
  open(this,(char *)local_a8,(int)id,local_c8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  store(this,"code","OBJ");
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"parameters","");
  open(this,(char *)local_48,__oflag);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  store_parm(this,"d",&material->ptr->d);
  store_parm(this,"Ka",&material->ptr->Ka);
  store_parm(this,"Kd",&material->ptr->Kd);
  store_parm(this,"Ks",&material->ptr->Ks);
  store_parm(this,"Kt",&material->ptr->Kt);
  store_parm(this,"Ns",&material->ptr->Ns);
  store_parm(this,"Ni",&material->ptr->Ni);
  local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->ptr->_map_d).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (material->ptr->_map_d).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  store_parm(this,"map_d",&local_d8);
  if (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->ptr->_map_Kd).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (material->ptr->_map_Kd).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  store_parm(this,"map_Kd",&local_e8);
  if (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->ptr->_map_Ks).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (material->ptr->_map_Ks).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  store_parm(this,"map_Ks",&local_f8);
  if (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->ptr->_map_Ns).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (material->ptr->_map_Ns).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  store_parm(this,"map_Ns",&local_108);
  if (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (material->ptr->_map_Displ).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (material->ptr->_map_Displ).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  store_parm(this,"map_Displ",&local_118);
  if (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"parameters","");
  close(this,(int)(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"material","");
  close(this,(int)(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<OBJMaterial> material, ssize_t id)
  {
    open("material",id,material->name);
    store("code","OBJ");
    open("parameters");
    store_parm("d",material->d);
    store_parm("Ka",material->Ka);
    store_parm("Kd",material->Kd);
    store_parm("Ks",material->Ks);
    store_parm("Kt",material->Kt);
    store_parm("Ns",material->Ns);
    store_parm("Ni",material->Ni);
    store_parm("map_d",material->_map_d);
    store_parm("map_Kd",material->_map_Kd);
    store_parm("map_Ks",material->_map_Ks);
    store_parm("map_Ns",material->_map_Ns);
    store_parm("map_Displ",material->_map_Displ);
    close("parameters");
    close("material");
  }